

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O3

void __thiscall bro::args_t::args_t(args_t *this,int argc,char **argv)

{
  bro bVar1;
  bro *pbVar2;
  bro *pbVar3;
  int iVar4;
  int *piVar5;
  char **ppcVar6;
  bro bVar7;
  int iVar8;
  bro bVar9;
  long lVar10;
  
  this->force = false;
  this->verbose = false;
  this->decompress = false;
  this->no_copy_stat = false;
  this->input_file = (char *)0x0;
  this->output_file = (char *)0x0;
  *(undefined8 *)((long)&this->output_file + 4) = 0;
  *(undefined8 *)((long)&this->custom_dictionary + 4) = 0;
  this->repeat = 1;
  this->window = 0x16;
  this->fail = true;
  if (argc != 1) {
    iVar8 = 1;
    do {
      pbVar2 = (bro *)argv[iVar8];
      if (*pbVar2 != (bro)0x2d) {
        bro::args_t(pbVar2);
        return;
      }
      bVar7 = pbVar2[1];
      bVar9 = (bro)0x0;
      lVar10 = 0;
      do {
        pbVar3 = *(bro **)((long)args_t::switches + lVar10);
        bVar1 = pbVar3[1];
        if (bVar1 == (bro)0x0) {
          bVar9 = *pbVar3;
        }
        if ((*pbVar3 == bVar7) &&
           (iVar4 = strcmp((char *)(pbVar3 + 1),(char *)(pbVar2 + 2)), iVar4 == 0)) {
          switch(bVar9) {
          case (bro)0x64:
          case (bro)0x75:
            this->decompress = true;
            break;
          case (bro)0x66:
            this->force = true;
            break;
          case (bro)0x69:
          case (bro)0x6f:
            iVar8 = iVar8 + 1;
            if (iVar8 == argc) {
              bro::args_t(pbVar2);
              return;
            }
            ppcVar6 = &this->output_file;
            if (bVar9 == (bro)0x69) {
              ppcVar6 = &this->input_file;
            }
            *ppcVar6 = argv[iVar8];
            break;
          case (bro)0x71:
          case (bro)0x72:
          case (bro)0x77:
            iVar8 = iVar8 + 1;
            if (iVar8 == argc) {
              bro::args_t(pbVar2);
              return;
            }
            piVar5 = &this->window;
            if (bVar9 == (bro)0x72) {
              piVar5 = &this->repeat;
            }
            if (bVar9 == (bro)0x71) {
              piVar5 = &this->quality;
            }
            *piVar5 = 0;
            pbVar2 = (bro *)argv[iVar8];
            bVar7 = *pbVar2;
            if (bVar7 != (bro)0x0) {
              iVar4 = 0;
              do {
                if ((byte)((char)bVar7 - 0x3aU) < 0xf6) {
                  bro::args_t(pbVar2);
                  return;
                }
                iVar4 = (uint)(byte)bVar7 + iVar4 * 10 + -0x30;
                *piVar5 = iVar4;
                bVar7 = *pbVar2;
              } while (bVar7 != (bro)0x0);
            }
            break;
          case (bro)0x76:
            this->verbose = true;
            break;
          default:
            if (bVar9 == (bro)0x4e) {
              if (bVar1 == (bro)0x0) {
                bro::args_t(pbVar2);
                return;
              }
              this->no_copy_stat = true;
              break;
            }
          case (bro)0x65:
          case (bro)0x67:
          case (bro)0x68:
          case (bro)0x6a:
          case (bro)0x6b:
          case (bro)0x6c:
          case (bro)0x6d:
          case (bro)0x6e:
          case (bro)0x70:
          case (bro)0x73:
          case (bro)0x74:
            bro::args_t(pbVar2);
            return;
          }
          break;
        }
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0xb0);
      iVar8 = iVar8 + 1;
    } while (iVar8 != argc);
    if (99 < this->quality) {
      bro::args_t();
      return;
    }
  }
  if (this->window - 0x19U < 0xfffffff1) {
    bro::args_t();
  }
  else {
    this->fail = false;
  }
  return;
}

Assistant:

args_t(int argc, const char **argv) {
      static const char *switches[] = {
        "f", "-force",
        "d", "-decompress", "-uncompress",
        "v", "-verbose",
        "N", "-no-copy-stat",
        "i", "-in", "-input",
        "o", "-out", "-output"
        "D", "-custom-dictionary",
        "q", "-quality",
        "r", "-repeat",
        "w", "-window",
      };

      for (int i = 1; i != argc; ++i) {
        const char *arg = argv[i];
        if (arg[0] == '-') {
          char short_code = '\0';
          for (auto sw : switches) {
            if (!sw[1]) short_code = sw[0];
            if (sw[0] == arg[1] && !strcmp(sw+1, arg+2)) {
              switch(short_code) {
                case 'f': {
                  force = true;
                } break;
                case 'd': case 'u': {
                  decompress = true;
                } break;
                case 'v': {
                  verbose = true;
                } break;
                case 'N': {
                  if (!sw[1]) { error(arg, "unknown argument", switches); return; }
                  no_copy_stat = true;
                } break;
                case 'i': case 'o': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  if (short_code == 'D' && !sw[1]) { error(arg, "unknown argument", switches); return; }
                  const char * &rhs = short_code == 'i' ? input_file : 'o' ? output_file : custom_dictionary;
                  rhs = argv[++i];
                } break;
                case 'q': case 'r': case 'w': {
                  if (i+1 == argc) { error(arg, "too few arguments", switches); return; }
                  int &rhs = short_code == 'q' ? quality : short_code == 'r' ? repeat : window;
                  rhs = 0;
                  const char *p = argv[++i];
                  while (*p) {
                    if (*p < '0' || *p > '9') { error(p, "expected number", switches); return; }
                    rhs = rhs * 10 + *p - '0';
                  }
                } break;
                default: {
                  error(arg, "unknown argument", switches); return;
                } break;
              }
              break;
            }
          }
        } else {
          error(arg, "unexpected argument", switches);
          return;
        }
      }

      if (quality > 99) {
        error("", "quality out of range", switches);
      } else if (window < 10 || window >= 25) {
        error("", "window out of range", switches);
      } else {
        fail = false;
      }
    }